

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.hpp
# Opt level: O1

bool ruckig::Block::calculate_block<6ul,true>
               (Block *block,array<ruckig::Profile,_6UL> *valid_profiles,
               size_t valid_profile_counter)

{
  void *__src;
  Profile *pPVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  array<ruckig::Profile,_6UL> *__src_00;
  double *pdVar8;
  double *pdVar9;
  array<double,_2UL> *paVar10;
  Profile *pPVar11;
  void *pvVar12;
  void *pvVar13;
  byte bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double local_260 [10];
  double local_210 [14];
  undefined4 local_1a0;
  undefined1 local_198 [360];
  
  bVar14 = 0;
  if (valid_profile_counter == 4) {
    dVar15 = valid_profiles->_M_elems[0].t_sum._M_elems[6];
    if ((7.105427357601002e-15 <= ABS(dVar15 - valid_profiles->_M_elems[1].t_sum._M_elems[6])) ||
       (valid_profiles->_M_elems[0].direction == valid_profiles->_M_elems[1].direction)) {
      dVar17 = valid_profiles->_M_elems[3].t_sum._M_elems[6];
      if (((ABS(valid_profiles->_M_elems[2].t_sum._M_elems[6] - dVar17) < 5.6843418860808015e-14) &&
          (valid_profiles->_M_elems[2].direction != valid_profiles->_M_elems[3].direction)) ||
         ((ABS(dVar15 - dVar17) < 5.6843418860808015e-14 &&
          (valid_profiles->_M_elems[0].direction != valid_profiles->_M_elems[3].direction))))
      goto LAB_001444c2;
    }
    else {
      pPVar11 = valid_profiles->_M_elems + 2;
      lVar4 = 2;
      do {
        memcpy(pPVar11 + -1,pPVar11,0x23c);
        pPVar11 = pPVar11 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
LAB_001444c2:
      valid_profile_counter = 3;
LAB_001444c5:
      __src_00 = valid_profiles;
      if (1 < valid_profile_counter) {
        pPVar11 = valid_profiles->_M_elems;
        lVar4 = valid_profile_counter * 0x240 + -0x240;
        do {
          pPVar11 = pPVar11 + 1;
          dVar15 = __src_00->_M_elems[0].t_sum._M_elems[6];
          pdVar8 = (pPVar11->t_sum)._M_elems + 6;
          pPVar1 = pPVar11;
          if (dVar15 < *pdVar8 || dVar15 == *pdVar8) {
            pPVar1 = __src_00->_M_elems;
          }
          __src_00 = (array<ruckig::Profile,_6UL> *)pPVar1;
          lVar4 = lVar4 + -0x240;
        } while (lVar4 != 0);
      }
      memcpy(block,__src_00,0x23c);
      block->t_min = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                     (block->p_min).accel.duration;
      if ((block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
        (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
      }
      if ((block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
        (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
      }
      lVar4 = ((long)__src_00 - (long)valid_profiles >> 6) * -0x71c71c71c71c71c7;
      if (valid_profile_counter == 5) {
        lVar5 = ((lVar4 + 3U) / 5) * -5 + lVar4 + 3;
        lVar7 = lVar4 + ((lVar4 + 4U) / 5) * -5 + 4;
        lVar6 = (lVar4 + ((lVar4 + 1U) / 5) * -5 + 1) * 0x240;
        pvVar13 = (void *)((long)valid_profiles + lVar6);
        lVar4 = (((lVar4 + 2U) / 5) * -5 + lVar4 + 2) * 0x240;
        pvVar12 = (void *)((long)valid_profiles + lVar4);
        if (*(int *)((long)valid_profiles + lVar6 + 0x234) ==
            *(int *)((long)valid_profiles + lVar4 + 0x234)) {
          dVar18 = *(double *)((long)pvVar13 + 0x68) + *(double *)((long)pvVar13 + 0x168) +
                   *(double *)((long)pvVar13 + 0x1c0);
          dVar15 = *(double *)((long)pvVar12 + 0x168);
          dVar17 = *(double *)((long)pvVar12 + 0x1c0);
          dVar19 = *(double *)((long)pvVar12 + 0x68) + dVar15 + dVar17;
          dVar16 = dVar18;
          if (dVar19 <= dVar18) {
            dVar16 = dVar19;
            dVar17 = *(double *)((long)pvVar13 + 0x1c0);
            dVar15 = *(double *)((long)pvVar13 + 0x168);
            pvVar12 = pvVar13;
            dVar19 = dVar18;
          }
          memcpy(local_198,pvVar12,0x168);
          pdVar8 = (double *)((long)pvVar12 + 0x170);
          pdVar9 = local_260;
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            *pdVar9 = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
          }
          pdVar8 = (double *)((long)pvVar12 + 0x1c8);
          pdVar9 = local_210;
          for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
            *pdVar9 = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
          }
          local_1a0 = *(undefined4 *)((long)pvVar12 + 0x238);
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar16;
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar19;
          bVar2 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                  super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
          memcpy((void *)((long)&(block->a).
                                 super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                 _M_payload + 0x10),local_198,0x168);
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.
          duration = dVar15;
          pdVar8 = local_260;
          paVar10 = (array<double,_2UL> *)
                    ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                            _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                            _M_payload._M_value.profile.brake + 8);
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            paVar10->_M_elems[0] = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
          }
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.
          duration = dVar17;
          pdVar8 = local_210;
          paVar10 = (array<double,_2UL> *)
                    ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                            _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                            _M_payload._M_value.profile.accel + 8);
          for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
            paVar10->_M_elems[0] = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
          }
          if (bVar2 == false) {
            (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
            super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
          }
          lVar5 = lVar5 * 0x240;
          lVar7 = lVar7 * 0x240;
          dVar15 = *(double *)((long)valid_profiles + lVar5 + 0x168);
          dVar17 = *(double *)((long)valid_profiles + lVar5 + 0x1c0);
          dVar20 = *(double *)((long)valid_profiles + lVar5 + 0x68) + dVar15 + dVar17;
          dVar19 = *(double *)((long)valid_profiles + lVar7 + 0x168);
          dVar16 = *(double *)((long)valid_profiles + lVar7 + 0x1c0);
          dVar18 = *(double *)((long)valid_profiles + lVar7 + 0x68) + dVar19 + dVar16;
          if (dVar18 <= dVar20) {
            lVar7 = lVar5;
          }
          pvVar12 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems + lVar7);
          pvVar13 = pvVar12;
          if (dVar18 <= dVar20) {
LAB_00144a5a:
            pvVar13 = pvVar12;
            dVar16 = dVar17;
            dVar19 = dVar15;
          }
        }
        else {
          lVar7 = lVar7 * 0x240;
          dVar18 = *(double *)((long)pvVar13 + 0x68) + *(double *)((long)pvVar13 + 0x168) +
                   *(double *)((long)pvVar13 + 0x1c0);
          dVar15 = *(double *)((long)valid_profiles + lVar7 + 0x168);
          dVar17 = *(double *)((long)valid_profiles + lVar7 + 0x1c0);
          dVar19 = *(double *)((long)valid_profiles + lVar7 + 0x68) + dVar15 + dVar17;
          dVar16 = dVar18;
          __src = (void *)((long)valid_profiles + lVar7);
          if (dVar19 <= dVar18) {
            dVar16 = dVar19;
            dVar17 = *(double *)((long)pvVar13 + 0x1c0);
            dVar15 = *(double *)((long)pvVar13 + 0x168);
            __src = pvVar13;
            dVar19 = dVar18;
          }
          memcpy(local_198,__src,0x168);
          pdVar8 = (double *)((long)__src + 0x170);
          pdVar9 = local_260;
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            *pdVar9 = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
          }
          pdVar8 = (double *)((long)__src + 0x1c8);
          pdVar9 = local_210;
          for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
            *pdVar9 = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
          }
          local_1a0 = *(undefined4 *)((long)__src + 0x238);
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar16;
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar19;
          bVar2 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                  super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
          memcpy((void *)((long)&(block->a).
                                 super__Optional_base<ruckig::Block::Interval,_true,_true>.
                                 _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                                 _M_payload + 0x10),local_198,0x168);
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.
          duration = dVar15;
          pdVar8 = local_260;
          paVar10 = (array<double,_2UL> *)
                    ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                            _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                            _M_payload._M_value.profile.brake + 8);
          for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
            paVar10->_M_elems[0] = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
          }
          (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.
          duration = dVar17;
          pdVar8 = local_210;
          paVar10 = (array<double,_2UL> *)
                    ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                            _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                            _M_payload._M_value.profile.accel + 8);
          for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
            paVar10->_M_elems[0] = *pdVar8;
            pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
            paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
          }
          if (bVar2 == false) {
            (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
            super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
          }
          lVar5 = lVar5 * 0x240;
          dVar15 = *(double *)((long)pvVar12 + 0x168);
          dVar17 = *(double *)((long)pvVar12 + 0x1c0);
          dVar20 = *(double *)((long)pvVar12 + 0x68) + dVar15 + dVar17;
          dVar19 = *(double *)((long)valid_profiles + lVar5 + 0x168);
          dVar16 = *(double *)((long)valid_profiles + lVar5 + 0x1c0);
          dVar18 = *(double *)((long)valid_profiles + lVar5 + 0x68) + dVar19 + dVar16;
          pvVar13 = (void *)((long)valid_profiles + lVar5);
          if (dVar18 <= dVar20) goto LAB_00144a5a;
        }
        dVar15 = dVar20;
        if (dVar18 <= dVar20) {
          dVar15 = dVar18;
          dVar18 = dVar20;
        }
        memcpy(local_198,pvVar13,0x168);
        pdVar8 = (double *)((long)pvVar13 + 0x170);
        pdVar9 = local_260;
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *pdVar9 = *pdVar8;
          pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
          pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
        }
        pdVar8 = (double *)((long)pvVar13 + 0x1c8);
        pdVar9 = local_210;
        for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
          *pdVar9 = *pdVar8;
          pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
          pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
        }
        local_1a0 = *(undefined4 *)((long)pvVar13 + 0x238);
        (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar15;
        (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar18;
        bVar2 = (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
        memcpy((void *)((long)&(block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                               _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                               _M_payload + 0x10),local_198,0x168);
        (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.
        duration = dVar19;
        pdVar8 = local_260;
        paVar10 = (array<double,_2UL> *)
                  ((long)&(block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                          _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                          _M_payload._M_value.profile.brake + 8);
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          paVar10->_M_elems[0] = *pdVar8;
          pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
          paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
        }
        (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.
        duration = dVar16;
        pdVar8 = local_210;
        paVar10 = (array<double,_2UL> *)
                  ((long)&(block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                          _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                          _M_payload._M_value.profile.accel + 8);
        for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
          paVar10->_M_elems[0] = *pdVar8;
          pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
          paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
        }
        if (bVar2 == false) {
          (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
        }
        goto LAB_00144b5b;
      }
      if (valid_profile_counter == 3) {
        lVar7 = (lVar4 + ((lVar4 + 1U) / 3) * -3 + 1) * 0x240;
        lVar4 = (((lVar4 + 2U) / 3) * -3 + lVar4 + 2) * 0x240;
        dVar19 = *(double *)((long)valid_profiles + lVar7 + 0x168);
        dVar16 = *(double *)((long)valid_profiles + lVar7 + 0x1c0);
        dVar20 = *(double *)((long)valid_profiles + lVar7 + 0x68) + dVar19 + dVar16;
        dVar15 = *(double *)((long)valid_profiles + lVar4 + 0x168);
        dVar17 = *(double *)((long)valid_profiles + lVar4 + 0x1c0);
        dVar18 = *(double *)((long)valid_profiles + lVar4 + 0x68) + dVar15 + dVar17;
        if (dVar18 <= dVar20) {
          lVar4 = lVar7;
        }
        pvVar13 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems + lVar4);
        pvVar12 = pvVar13;
        if (dVar18 <= dVar20) goto LAB_0014434a;
        goto LAB_00144352;
      }
    }
LAB_00144630:
    bVar2 = false;
  }
  else {
    if (valid_profile_counter != 2) {
      if (valid_profile_counter == 1) goto LAB_0014414c;
      if ((valid_profile_counter & 1) == 0) goto LAB_00144630;
      goto LAB_001444c5;
    }
    dVar15 = valid_profiles->_M_elems[0].t_sum._M_elems[6];
    dVar17 = valid_profiles->_M_elems[1].t_sum._M_elems[6];
    if (ABS(dVar15 - dVar17) < 1.7763568394002505e-15) {
LAB_0014414c:
      memcpy(block,valid_profiles,0x23c);
      block->t_min = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                     (block->p_min).accel.duration;
      if ((block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
        (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
      }
      if ((block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
          super__Optional_payload_base<ruckig::Block::Interval>._M_engaged != true) {
        return true;
      }
      (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
      return true;
    }
    pvVar13 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems +
                      (ulong)((uint)(dVar17 <= dVar15) * 0x240));
    memcpy(block,pvVar13,0x23c);
    block->t_min = (block->p_min).t_sum._M_elems[6] + (block->p_min).brake.duration +
                   (block->p_min).accel.duration;
    if ((block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
    }
    if ((block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
        super__Optional_payload_base<ruckig::Block::Interval>._M_engaged == true) {
      (block->b).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = false;
    }
    uVar3 = (ulong)((uint)(dVar15 < dVar17) * 0x240);
    dVar19 = *(double *)((long)pvVar13 + 0x168);
    dVar16 = *(double *)((long)pvVar13 + 0x1c0);
    dVar20 = *(double *)((long)pvVar13 + 0x68) + dVar19 + dVar16;
    dVar15 = *(double *)((long)valid_profiles->_M_elems[0].brake.t._M_elems + (uVar3 - 8));
    dVar17 = *(double *)((long)valid_profiles->_M_elems[0].accel.t._M_elems + (uVar3 - 8));
    dVar18 = *(double *)((long)valid_profiles->_M_elems[0].t_sum._M_elems + uVar3 + 0x30) + dVar15 +
             dVar17;
    pvVar12 = (void *)((long)valid_profiles->_M_elems[0].t._M_elems + uVar3);
    if (dVar18 <= dVar20) {
LAB_0014434a:
      pvVar12 = pvVar13;
      dVar17 = dVar16;
      dVar15 = dVar19;
    }
LAB_00144352:
    dVar19 = dVar20;
    if (dVar18 <= dVar20) {
      dVar19 = dVar18;
      dVar18 = dVar20;
    }
    memcpy(local_198,pvVar12,0x168);
    pdVar8 = (double *)((long)pvVar12 + 0x170);
    pdVar9 = local_260;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar9 = *pdVar8;
      pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
      pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
    }
    pdVar8 = (double *)((long)pvVar12 + 0x1c8);
    pdVar9 = local_210;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar9 = *pdVar8;
      pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
      pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
    }
    local_1a0 = *(undefined4 *)((long)pvVar12 + 0x238);
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.left = dVar19;
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.right = dVar18;
    bVar2 = (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
            super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
    memcpy((void *)((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                           _M_payload.super__Optional_payload_base<ruckig::Block::Interval>.
                           _M_payload + 0x10),local_198,0x168);
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.brake.duration
         = dVar15;
    pdVar8 = local_260;
    paVar10 = (array<double,_2UL> *)
              ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                      _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                      _M_value.profile.brake + 8);
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      paVar10->_M_elems[0] = *pdVar8;
      pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
      paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
    }
    (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
    super__Optional_payload_base<ruckig::Block::Interval>._M_payload._M_value.profile.accel.duration
         = dVar17;
    pdVar8 = local_210;
    paVar10 = (array<double,_2UL> *)
              ((long)&(block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>.
                      _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_payload.
                      _M_value.profile.accel + 8);
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      paVar10->_M_elems[0] = *pdVar8;
      pdVar8 = pdVar8 + (ulong)bVar14 * -2 + 1;
      paVar10 = (array<double,_2UL> *)(paVar10[-(ulong)bVar14]._M_elems + 1);
    }
    if (bVar2 == false) {
      (block->a).super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
      super__Optional_payload_base<ruckig::Block::Interval>._M_engaged = true;
    }
LAB_00144b5b:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool calculate_block(Block& block, std::array<Profile, N>& valid_profiles, size_t valid_profile_counter) {
        // std::cout << "---\n " << valid_profile_counter << std::endl;
        // for (size_t i = 0; i < valid_profile_counter; ++i) {
        //     std::cout << valid_profiles[i].t_sum.back() << " " << valid_profiles[i].to_string() << std::endl;
        // }

        if (valid_profile_counter == 1) {
            block.set_min_profile(valid_profiles[0]);
            return true;

        } else if (valid_profile_counter == 2) {
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 8 * std::numeric_limits<double>::epsilon()) {
                block.set_min_profile(valid_profiles[0]);
                return true;
            }

            if constexpr (numerical_robust) {
                const size_t idx_min = (valid_profiles[0].t_sum.back() < valid_profiles[1].t_sum.back()) ? 0 : 1;
                const size_t idx_else_1 = (idx_min + 1) % 2;

                block.set_min_profile(valid_profiles[idx_min]);
                block.a = Interval(valid_profiles[idx_min], valid_profiles[idx_else_1]);
                return true;
            }

        // Only happens due to numerical issues
        } else if (valid_profile_counter == 4) {
            // Find "identical" profiles
            if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[1].t_sum.back()) < 32 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[1].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 1);
            } else if (std::abs(valid_profiles[2].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[2].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else if (std::abs(valid_profiles[0].t_sum.back() - valid_profiles[3].t_sum.back()) < 256 * std::numeric_limits<double>::epsilon() && valid_profiles[0].direction != valid_profiles[3].direction) {
                remove_profile<N>(valid_profiles, valid_profile_counter, 3);
            } else {
                return false;
            }

        } else if (valid_profile_counter % 2 == 0) {
            return false;
        }

        // Find index of fastest profile
        const auto idx_min_it = std::min_element(valid_profiles.cbegin(), valid_profiles.cbegin() + valid_profile_counter, [](const Profile& a, const Profile& b) { return a.t_sum.back() < b.t_sum.back(); });
        const size_t idx_min = std::distance(valid_profiles.cbegin(), idx_min_it);

        block.set_min_profile(valid_profiles[idx_min]);

        if (valid_profile_counter == 3) {
            const size_t idx_else_1 = (idx_min + 1) % 3;
            const size_t idx_else_2 = (idx_min + 2) % 3;

            block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
            return true;

        } else if (valid_profile_counter == 5) {
            const size_t idx_else_1 = (idx_min + 1) % 5;
            const size_t idx_else_2 = (idx_min + 2) % 5;
            const size_t idx_else_3 = (idx_min + 3) % 5;
            const size_t idx_else_4 = (idx_min + 4) % 5;

            if (valid_profiles[idx_else_1].direction == valid_profiles[idx_else_2].direction) {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_2]);
                block.b = Interval(valid_profiles[idx_else_3], valid_profiles[idx_else_4]);
            } else {
                block.a = Interval(valid_profiles[idx_else_1], valid_profiles[idx_else_4]);
                block.b = Interval(valid_profiles[idx_else_2], valid_profiles[idx_else_3]);
            }
            return true;
        }

        return false;
    }